

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_10::DrawInstancedIndexed::iterate
          (TestStatus *__return_storage_ptr__,DrawInstancedIndexed *this)

{
  VkPrimitiveTopology VVar1;
  DeviceInterface *pDVar2;
  VkCommandBuffer_s *pVVar3;
  VkOffset3D offset;
  qpTestResult code;
  VkQueue log_00;
  bool bVar4;
  VkResult VVar5;
  int iVar6;
  int iVar7;
  TestContext *this_00;
  size_type sVar8;
  VkDevice pVVar9;
  Allocator *pAVar10;
  Buffer *pBVar11;
  void *dst;
  reference src;
  VkDeviceSize VVar12;
  VkBuffer VVar13;
  VkCommandBuffer_s **ppVVar14;
  Handle<(vk::HandleType)18> *pHVar15;
  PixelBufferAccess *pPVar16;
  Image *this_01;
  ConstPixelBufferAccess *reference;
  char *__s;
  SharedPtr<vkt::Draw::Buffer> *this_02;
  Move<vk::VkCommandBuffer_s_*> *pMVar17;
  float fVar18;
  float fVar19;
  allocator<char> local_2b1;
  string local_2b0;
  qpTestResult local_28c;
  void *pvStack_288;
  qpTestResult res;
  deInt32 local_280;
  undefined1 local_278 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  int local_22c;
  float xCoord;
  int x;
  float yCoord;
  int y;
  ReferenceImageInstancedCoordinates refInstancedCoords;
  deInt32 frameHeight;
  deInt32 frameWidth;
  undefined1 local_1e0 [8];
  Texture2D referenceFrame;
  undefined8 uStack_188;
  VkSubmitInfo submitInfo;
  VkBuffer indexBuffer;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Allocation local_f0;
  VkDeviceMemory local_d0;
  Allocation local_c8;
  void *local_a8;
  deUint8 *ptr;
  BufferCreateInfo local_90;
  SharedPtr<vkt::Draw::Buffer> local_40;
  Handle<(vk::HandleType)8> local_30;
  VkDeviceSize dataSize;
  VkQueue queue;
  TestLog *log;
  DrawInstancedIndexed *this_local;
  
  log = (TestLog *)this;
  this_local = (DrawInstancedIndexed *)__return_storage_ptr__;
  this_00 = Context::getTestContext
                      ((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  queue = (VkQueue)tcu::TestContext::getLog(this_00);
  dataSize = (VkDeviceSize)
             Context::getUniversalQueue
                       ((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                        m_context);
  DrawTestsBaseClass::beginRenderPass((DrawTestsBaseClass *)this);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&(this->super_DrawIndexed).m_indexes);
  local_30.m_internal = sVar8 << 2;
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  pVVar9 = Context::getDevice((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                              m_context);
  BufferCreateInfo::BufferCreateInfo
            (&local_90,local_30.m_internal,0x40,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar10 = Context::getDefaultAllocator
                      ((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  ptr._0_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)&local_40,pDVar2,pVVar9,&local_90.super_VkBufferCreateInfo,pAVar10,
             ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Buffer>::operator=(&(this->super_DrawIndexed).m_indexBuffer,&local_40);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_40);
  BufferCreateInfo::~BufferCreateInfo(&local_90);
  this_02 = &(this->super_DrawIndexed).m_indexBuffer;
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory(&local_c8,pBVar11);
  dst = ::vk::Allocation::getHostPtr(&local_c8);
  ::vk::Allocation::~Allocation(&local_c8);
  local_a8 = dst;
  src = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (&(this->super_DrawIndexed).m_indexes,0);
  ::deMemcpy(dst,src,local_30.m_internal);
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  pVVar9 = Context::getDevice((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                              m_context);
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory(&local_f0,pBVar11);
  local_d0 = ::vk::Allocation::getMemory(&local_f0);
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory((Allocation *)&vertexBufferOffset,pBVar11);
  VVar12 = ::vk::Allocation::getOffset((Allocation *)&vertexBufferOffset);
  ::vk::flushMappedMemoryRange(pDVar2,pVVar9,local_d0,VVar12,local_30.m_internal);
  ::vk::Allocation::~Allocation((Allocation *)&vertexBufferOffset);
  ::vk::Allocation::~Allocation(&local_f0);
  vertexBuffer.m_internal = 0;
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DrawIndexed).super_DrawTestsBaseClass.m_vertexBuffer);
  indexBuffer = Draw::Buffer::object(pBVar11);
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&(this->super_DrawIndexed).m_indexBuffer);
  VVar13 = Draw::Buffer::object(pBVar11);
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  pMVar17 = &(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer;
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&pMVar17->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x58])(pDVar2,*ppVVar14,0,1,&indexBuffer,&vertexBuffer);
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&pMVar17->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x57])(pDVar2,*ppVVar14,VVar13.m_internal,0,1);
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&pMVar17->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar14;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->super_DrawIndexed).super_DrawTestsBaseClass.m_pipeline.
                        super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar3,0,pHVar15->m_internal);
  VVar1 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_topology;
  if (VK_PRIMITIVE_TOPOLOGY_LINE_STRIP < VVar1) {
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
      ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           (&(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                             super_RefBase<vk::VkCommandBuffer_s_*>);
      (*pDVar2->_vptr_DeviceInterface[0x5a])(pDVar2,*ppVVar14,6,4,2,0xd,2);
    }
    else if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
      ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           (&(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer.
                             super_RefBase<vk::VkCommandBuffer_s_*>);
      (*pDVar2->_vptr_DeviceInterface[0x5a])(pDVar2,*ppVVar14,4,4,2,0xd,2);
    }
  }
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  pMVar17 = &(this->super_DrawIndexed).super_DrawTestsBaseClass.m_cmdBuffer;
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&pMVar17->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x76])(pDVar2,*ppVVar14);
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&pMVar17->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,*ppVVar14);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_188 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&pMVar17->super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar12 = dataSize;
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  VVar5 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,VVar12,1,&uStack_188);
  ::vk::checkResult(VVar5,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x131);
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,dataSize);
  ::vk::checkResult(VVar5,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x133);
  pDVar2 = (this->super_DrawIndexed).super_DrawTestsBaseClass.m_vk;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,dataSize);
  ::vk::checkResult(VVar5,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0x136);
  _frameHeight = ::vk::mapVkFormat((this->super_DrawIndexed).super_DrawTestsBaseClass.
                                   m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_1e0,(TextureFormat *)&frameHeight,0x100,0x100);
  tcu::Texture2D::allocLevel((Texture2D *)local_1e0,0);
  iVar6 = tcu::Texture2D::getWidth((Texture2D *)local_1e0);
  iVar7 = tcu::Texture2D::getHeight((Texture2D *)local_1e0);
  pPVar16 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_1e0,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&refInstancedCoords.bottom,0.0,0.0,0.0,1.0);
  tcu::clear(pPVar16,(Vec4 *)&refInstancedCoords.bottom);
  ReferenceImageInstancedCoordinates::ReferenceImageInstancedCoordinates
            ((ReferenceImageInstancedCoordinates *)&yCoord);
  for (x = 0; x < iVar7; x = x + 1) {
    fVar18 = (float)x / ((float)iVar7 * 0.5) - 1.0;
    for (local_22c = 0; local_22c < iVar6; local_22c = local_22c + 1) {
      fVar19 = (float)local_22c / ((float)iVar6 * 0.5) - 1.0;
      if ((((refInstancedCoords.top <= (double)fVar18) &&
           ((double)fVar18 <= refInstancedCoords.right)) && (_yCoord <= (double)fVar19)) &&
         ((double)fVar19 <= refInstancedCoords.left)) {
        pPVar16 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_1e0,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.z,0.0,0.0,1.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar16,(Vec4 *)&zeroOffset.z,local_22c,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_01 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawIndexed).super_DrawTestsBaseClass.m_colorTargetImage);
  VVar12 = dataSize;
  pAVar10 = Context::getDefaultAllocator
                      ((this->super_DrawIndexed).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  local_280 = zeroOffset.x;
  pvStack_288 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_278,this_01,(VkQueue)VVar12,pAVar10,
             VK_IMAGE_LAYOUT_GENERAL,offset,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  log_00 = queue;
  local_28c = QP_TEST_RESULT_PASS;
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_1e0,0)->
               super_ConstPixelBufferAccess;
  bVar4 = tcu::fuzzyCompare((TestLog *)log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_278,0.05,COMPARE_LOG_RESULT);
  if (!bVar4) {
    local_28c = QP_TEST_RESULT_FAIL;
  }
  code = local_28c;
  __s = qpGetTestResultName(local_28c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,__s,&local_2b1);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  tcu::Texture2D::~Texture2D((Texture2D *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawInstancedIndexed::iterate (void)
{
	tcu::TestLog &log		= m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize dataSize = m_indexes.size() * sizeof(deUint32);
	m_indexBuffer = Buffer::createAndAlloc(	m_vk, m_context.getDevice(),
											BufferCreateInfo(dataSize,
															 vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT),
											m_context.getDefaultAllocator(),
											vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indexBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_indexes[0], static_cast<size_t>(dataSize));
	vk::flushMappedMemoryRange(m_vk, m_context.getDevice(),
							   m_indexBuffer->getBoundMemory().getMemory(),
							   m_indexBuffer->getBoundMemory().getOffset(),
							   dataSize);

	const vk::VkDeviceSize vertexBufferOffset = 0;
	const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
	const vk::VkBuffer indexBuffer = m_indexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindIndexBuffer(*m_cmdBuffer, indexBuffer, 0, vk::VK_INDEX_TYPE_UINT32);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_vk.cmdDrawIndexed(*m_cmdBuffer, 6, 4, 2, VERTEX_OFFSET, 2);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_vk.cmdDrawIndexed(*m_cmdBuffer, 4, 4, 2, VERTEX_OFFSET, 2);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	VK_CHECK(m_vk.queueWaitIdle(queue));

	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	referenceFrame.allocLevel(0);

	const deInt32 frameWidth = referenceFrame.getWidth();
	const deInt32 frameHeight = referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageInstancedCoordinates refInstancedCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refInstancedCoords.bottom	&&
				 yCoord <= refInstancedCoords.top		&&
				 xCoord >= refInstancedCoords.left		&&
				 xCoord <= refInstancedCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

}